

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::
generateReplacedExtensionsList<VulkanHppGenerator::generateExtensionInspectionFile()const::__8,VulkanHppGenerator::generateExtensionInspectionFile()const::__9>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,VulkanHppGenerator *this)

{
  bool bVar1;
  __type_conflict _Var2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  byte local_1eb;
  allocator<char> local_1ea;
  byte local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  type *local_108;
  type *leave;
  type *enter;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  reference local_88;
  ExtensionData *extension;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  *__range1;
  string previousLeave;
  string previousEnter;
  VulkanHppGenerator *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  string *extensionsList;
  
  local_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(previousLeave.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ::begin(&this->m_extensions);
  extension = (ExtensionData *)
              std::
              vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
              ::end(&this->m_extensions);
  while (bVar1 = __gnu_cxx::
                 operator==<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                           (&__end1,(__normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                                     *)&extension), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_88 = __gnu_cxx::
               __normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
               ::operator*(&__end1);
    bVar1 = generateExtensionInspectionFile::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&this_local + 7),local_88);
    if (bVar1) {
      getProtectFromTitle((string *)&enter,this,&local_88->name);
      generateProtection(&local_d8,this,(string *)&enter,true);
      std::__cxx11::string::~string((string *)&enter);
      leave = std::get<0ul,std::__cxx11::string,std::__cxx11::string>(&local_d8);
      local_108 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>(&local_d8);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&previousLeave.field_2 + 8),leave);
      local_1e9 = 0;
      local_1eb = 0;
      if (((_Var2 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        local_1eb = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"\n",&local_1ea);
      }
      else {
        std::operator+(&local_1e8,"\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range1);
        local_1e9 = 1;
        std::operator+(&local_1c8,&local_1e8,leave);
      }
      std::operator+(&local_1a8,&local_1c8,"{ \"");
      std::operator+(&local_188,&local_1a8,&local_88->name);
      std::operator+(&local_168,&local_188,"\", \"");
      const::$_9::operator()::ExtensionData_const___const
                (&local_210,(void *)((long)&this_local + 6),local_88);
      std::operator+(&local_148,&local_168,&local_210);
      std::operator+(&local_128,&local_148,"\"}, ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      if ((local_1eb & 1) != 0) {
        std::allocator<char>::~allocator(&local_1ea);
      }
      if ((local_1e9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&previousLeave.field_2 + 8),leave);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 local_108);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_d8);
    }
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (__return_storage_ptr__);
  if (!bVar1) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with(__return_storage_ptr__,", ");
    if (!bVar1) {
      __assert_fail("extensionsList.ends_with( \", \" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x28fe,
                    "std::string VulkanHppGenerator::generateReplacedExtensionsList(Predicate, Extraction) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:180:76), Extraction = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:181:74)]"
                   );
    }
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (__return_storage_ptr__);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_230,__return_storage_ptr__,0,sVar3 - 2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range1);
    if (!bVar1) {
      std::operator+(&local_250,"\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1)
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
    }
  }
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)(previousLeave.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateReplacedExtensionsList( Predicate p, Extraction e ) const
{
  std::string extensionsList, previousEnter, previousLeave;
  for ( auto const & extension : m_extensions )
  {
    if ( p( extension ) )
    {
      const auto [enter, leave] = generateProtection( getProtectFromTitle( extension.name ) );
      extensionsList +=
        ( ( previousEnter != enter ) ? ( "\n" + previousLeave + enter ) : "\n" ) + "{ \"" + extension.name + "\", \"" + e( extension ) + "\"}, ";
      previousEnter = enter;
      previousLeave = leave;
    }
  }
  if ( !extensionsList.empty() )
  {
    assert( extensionsList.ends_with( ", " ) );
    extensionsList = extensionsList.substr( 0, extensionsList.length() - 2 );
    if ( !previousLeave.empty() )
    {
      extensionsList += "\n" + previousLeave;
    }
  }
  return extensionsList;
}